

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O3

Abc_Cex_t * Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  Abc_Cex_t *pAVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  Gia_Obj_t *pGVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  long lVar16;
  
  if (pCex->nRegs < 1) {
    __assert_fail("pCex->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x162,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  uVar8 = 0;
  pAVar5 = Abc_CexAlloc(0,p->nObjs,pCex->iFrame + 1);
  iVar7 = pCex->iFrame;
  pAVar5->iPo = pCex->iPo;
  pAVar5->iFrame = iVar7;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  iVar7 = p->nRegs;
  if (0 < iVar7) {
    uVar15 = 0;
    do {
      iVar9 = p->vCos->nSize;
      uVar11 = (iVar9 - iVar7) + uVar15;
      if (((int)uVar11 < 0) || (iVar9 <= (int)uVar11)) goto LAB_00662bb5;
      iVar7 = p->vCos->pArray[uVar11];
      lVar10 = (long)iVar7;
      if ((lVar10 < 0) || (p->nObjs <= iVar7)) goto LAB_00662b96;
      pGVar13 = p->pObjs;
      if (pGVar13 == (Gia_Obj_t *)0x0) {
        uVar8 = (ulong)uVar15;
        break;
      }
      uVar11 = uVar15 + 1;
      uVar8 = (ulong)uVar11;
      *(ulong *)(pGVar13 + lVar10) =
           *(ulong *)(pGVar13 + lVar10) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar15 >> 5] >> ((byte)uVar15 & 0x1f) & 1) << 0x1e);
      iVar7 = p->nRegs;
      uVar15 = uVar11;
    } while ((int)uVar11 < iVar7);
  }
  iVar7 = (int)uVar8;
  if (iVar7 != pCex->nRegs) {
    __assert_fail("iBit == pCex->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x16c,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  if (-1 < pCex->iFrame) {
    iVar9 = 0;
    do {
      iVar6 = p->nRegs;
      pVVar14 = p->vCis;
      iVar7 = pVVar14->nSize;
      if (iVar6 < iVar7) {
        lVar10 = 0;
        do {
          if (iVar7 <= lVar10) goto LAB_00662bb5;
          lVar16 = (long)pVVar14->pArray[lVar10];
          if ((lVar16 < 0) || (p->nObjs <= pVVar14->pArray[lVar10])) goto LAB_00662b96;
          pGVar13 = p->pObjs;
          if (pGVar13 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar13 + lVar16) =
               *(ulong *)(pGVar13 + lVar16) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)(uVar8 + lVar10) >> 5] >>
                        ((byte)(uVar8 + lVar10) & 0x1f) & 1) << 0x1e);
          lVar10 = lVar10 + 1;
          iVar6 = p->nRegs;
          pVVar14 = p->vCis;
          iVar7 = pVVar14->nSize;
        } while (lVar10 < iVar7 - iVar6);
        uVar8 = (ulong)(uint)((int)uVar8 + (int)lVar10);
      }
      iVar7 = (int)uVar8;
      if (0 < iVar6) {
        iVar12 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar15 = (iVar1 - iVar6) + iVar12;
          if (((int)uVar15 < 0) || (iVar1 <= (int)uVar15)) goto LAB_00662bb5;
          iVar1 = p->vCos->pArray[uVar15];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00662b96;
          pGVar13 = p->pObjs;
          if (pGVar13 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar15 = (iVar2 - iVar6) + iVar12;
          if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_00662bb5;
          uVar15 = p->vCis->pArray[uVar15];
          lVar10 = (long)(int)uVar15;
          if ((lVar10 < 0) || ((uint)p->nObjs <= uVar15)) goto LAB_00662b96;
          *(ulong *)(pGVar13 + lVar10) =
               *(ulong *)(pGVar13 + lVar10) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar13 + iVar1) & 0x40000000);
          iVar12 = iVar12 + 1;
          iVar6 = p->nRegs;
        } while (iVar12 < iVar6);
      }
      iVar6 = p->nObjs;
      if (0 < iVar6) {
        pGVar13 = p->pObjs;
        if (pGVar13 != (Gia_Obj_t *)0x0) {
          lVar10 = 0;
          do {
            if ((pGVar13->field_0x3 & 0x40) != 0) {
              iVar6 = pAVar5->nPis * iVar9 + (int)lVar10;
              (&pAVar5[1].iPo)[iVar6 >> 5] =
                   (&pAVar5[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
              iVar6 = p->nObjs;
            }
            lVar10 = lVar10 + 1;
            pGVar13 = pGVar13 + 1;
          } while (lVar10 < iVar6);
          if (iVar6 < 1) goto LAB_00662aa6;
        }
        lVar10 = 0;
        lVar16 = 0;
        do {
          pGVar13 = p->pObjs;
          if (pGVar13 == (Gia_Obj_t *)0x0) break;
          uVar3 = *(ulong *)(&pGVar13->field_0x0 + lVar10);
          if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
            *(ulong *)(&pGVar13->field_0x0 + lVar10) =
                 uVar3 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar3 >> 0x3d) ^
                          *(uint *)((long)pGVar13 +
                                   (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3 + lVar10) >>
                          0x1e) & ((uint)(uVar3 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar13 +
                                           (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3 +
                                           lVar10) >> 0x1e) & 1) << 0x1e);
            iVar6 = p->nObjs;
          }
          lVar16 = lVar16 + 1;
          lVar10 = lVar10 + 0xc;
        } while (lVar16 < iVar6);
      }
LAB_00662aa6:
      pVVar14 = p->vCos;
      if (0 < pVVar14->nSize) {
        lVar10 = 0;
        do {
          iVar6 = pVVar14->pArray[lVar10];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00662b96;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar13 = p->pObjs + iVar6;
          uVar15 = (uint)*(ulong *)pGVar13;
          *(ulong *)pGVar13 =
               *(ulong *)pGVar13 & 0xffffffffbfffffff |
               (ulong)((uVar15 * 2 ^ *(uint *)(pGVar13 + -(ulong)(uVar15 & 0x1fffffff))) &
                      0x40000000);
          lVar10 = lVar10 + 1;
          pVVar14 = p->vCos;
        } while (lVar10 < pVVar14->nSize);
      }
      bVar4 = iVar9 < pCex->iFrame;
      iVar9 = iVar9 + 1;
    } while (bVar4);
  }
  if (iVar7 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x17b,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  uVar15 = pCex->iPo;
  iVar7 = p->vCos->nSize;
  if (iVar7 - p->nRegs <= (int)uVar15) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar15) && ((int)uVar15 < iVar7)) {
    iVar7 = p->vCos->pArray[uVar15];
    if ((-1 < (long)iVar7) && (iVar7 < p->nObjs)) {
      if ((p->pObjs[iVar7].field_0x3 & 0x40) == 0) {
        __assert_fail("Gia_ManPo(p, pCex->iPo)->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                      ,0x17c,
                      "Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)");
      }
      Gia_ManCleanMark0(p);
      return pAVar5;
    }
LAB_00662b96:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_00662bb5:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Abc_Cex_t * Gia_ManCexExtendToIncludeAllObjects( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k, iBit = 0;
    assert( pCex->nRegs > 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManObjNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    // set init state
    Gia_ManForEachRi( p, pObjRi, k )
        pObjRi->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    assert( iBit == pCex->nRegs );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
        Gia_ManForEachObj( p, pObj, k )
            if ( pObj->fMark0 )
                Abc_InfoSetBit( pNew->pData, pNew->nPis * i + k );
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    }
    assert( iBit == pCex->nBits );
    assert( Gia_ManPo(p, pCex->iPo)->fMark0 == 1 );
    Gia_ManCleanMark0(p);
    return pNew;
}